

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O0

void ObserverManager::subscribe<TicTacProtocol,B>(B *observer)

{
  mapped_type *pp_Var1;
  TicTacProtocol *local_18;
  B *observer_local;
  
  if (observer != (B *)0x0) {
    pp_Var1 = std::
              unordered_map<unsigned_long,_void_(*)(BaseObserverProtocol_*),_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>_>
              ::operator[](&unsubscribeMap,
                           &(observer->super_TicTacProtocol).super_BaseObserverProtocol.observerId);
    *pp_Var1 = ObserverContainer<TicTacProtocol>::removeObserver;
    local_18 = (TicTacProtocol *)0x0;
    if (observer != (B *)0x0) {
      local_18 = &observer->super_TicTacProtocol;
    }
    ObserverContainer<TicTacProtocol>::addObserver(local_18);
  }
  return;
}

Assistant:

static void subscribe(O* observer) {
        static_assert(std::is_base_of<BaseObserverProtocol, O>::value,
                      "All observers must inherit from BaseObserverProtocol");
        if (observer == nullptr) {
            return;
        }

        unsubscribeMap[observer->P::observerId] = &ObserverContainer<P>::removeObserver;
        ObserverContainer<P>::addObserver(observer);
    }